

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O2

int64_t __thiscall
r_comp::RepliStruct::parse
          (RepliStruct *this,istream *stream,uint64_t *curIndent,uint64_t *prevIndent,
          int64_t paramExpect)

{
  int64_t iVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  uint64_t uVar7;
  char cVar8;
  RepliStruct *this_00;
  string *psVar9;
  int64_t iStack_e0;
  shared_ptr<r_comp::RepliStruct> subStruct;
  long local_b8;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_b0;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *local_a0;
  int64_t local_98;
  uint local_8c;
  string *local_88;
  ulong *local_80;
  ulong *local_78;
  string str;
  string label;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = &this->cmd;
  local_a0 = &this->args;
  local_b8 = 0;
  local_8c = 0;
  local_98 = paramExpect;
  local_80 = curIndent;
  local_78 = prevIndent;
  cVar4 = '\0';
  do {
    while( true ) {
      if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) != 0) goto LAB_0012d021;
      this_00 = (RepliStruct *)stream;
      cVar2 = std::istream::get();
      if (cVar2 != '[') break;
      if (cVar4 == ':') {
        std::__cxx11::string::_M_assign((string *)&label);
        std::__cxx11::string::assign((char *)&str);
      }
      iVar5 = std::istream::peek();
      if (iVar5 == 0x5d) {
        std::istream::get();
        iVar5 = std::istream::peek();
        iVar5 = iVar5 * 0x1000000;
        if ((iVar5 < 0x20000000) || (iVar5 == 0x3b000000)) {
          local_8c = (uint)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1);
          cVar4 = cVar2;
        }
        else if ((cVar4 == ':') || (cVar4 < '!')) {
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                     &local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = this;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->label);
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,&subStruct);
          cVar4 = cVar2;
        }
        else {
          std::__cxx11::string::append((char *)&str);
          cVar4 = cVar2;
        }
      }
      else {
        if (str._M_string_length != 0) {
          if (((this->cmd)._M_string_length == 0) && (this->type != Set)) {
            std::__cxx11::string::_M_assign((string *)local_88);
            std::__cxx11::string::assign((char *)&str);
          }
          else {
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&subStruct.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                       &local_b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,(value_type *)
                                 &subStruct.
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       );
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(subStruct.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->cmd);
            std::__cxx11::string::assign((char *)&str);
            if ((0 < local_98) && (local_b8 = local_b8 + 1, local_b8 == local_98))
            goto LAB_0012d021;
          }
        }
        std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                   &local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
        (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent = this;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->label);
        std::__cxx11::string::assign((char *)&label);
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(local_a0,&subStruct);
        lVar6 = parse(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,stream,local_80,local_78,0);
LAB_0012ca4a:
        if (lVar6 < 0) goto LAB_0012d059;
        if ((0 < local_98) && (local_b8 = local_b8 + 1, local_b8 == local_98)) goto LAB_0012d021;
LAB_0012cdef:
        cVar4 = cVar2;
        if (lVar6 != 0) {
          iStack_e0 = lVar6 + -1;
          goto LAB_0012d023;
        }
      }
    }
    iVar5 = (int)cVar2;
    cVar8 = (char)&str;
    switch(iVar5) {
    case 0x20:
      cVar4 = cVar2;
      if (str._M_string_length != 0) {
        if (((this->cmd)._M_string_length == 0) && ((this->type | Directive) != Development)) {
LAB_0012cdfd:
          std::__cxx11::string::_M_assign((string *)local_88);
          std::__cxx11::string::assign((char *)&str);
          cVar4 = cVar2;
        }
        else {
          if ((*str._M_dataplus._M_p == '\"') &&
             (str._M_dataplus._M_p[str._M_string_length - 1] != '\"')) {
            std::__cxx11::string::push_back(cVar8);
            do {
              if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) != 0) break;
              cVar2 = std::istream::get();
              std::__cxx11::string::push_back(cVar8);
            } while (cVar2 != '\"');
          }
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                     &local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,(value_type *)
                               &subStruct.
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
          ;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cmd);
          std::__cxx11::string::assign((char *)&str);
LAB_0012cd3a:
          cVar4 = cVar2;
          if ((0 < local_98) && (local_b8 = local_b8 + 1, local_b8 == local_98)) goto LAB_0012d021;
        }
      }
      break;
    case 0x21:
      if (this->type != Root) {
LAB_0012cf7a:
        std::__cxx11::string::append((char *)&this->error);
        iStack_e0 = -1;
        goto LAB_0012d023;
      }
      std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                 &local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parent
           = this;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(local_a0,(value_type *)
                           &subStruct.
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
      bVar3 = parseDirective(subStruct.
                             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr,stream,local_80,local_78);
      cVar4 = cVar2;
      if (!bVar3) {
LAB_0012d059:
        iStack_e0 = -1;
LAB_0012d023:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&label);
        std::__cxx11::string::~string((string *)&str);
        return iStack_e0;
      }
      break;
    case 0x28:
      if (str._M_string_length != 0) {
        psVar9 = &label;
        if ((cVar4 == ':') ||
           (((this->cmd)._M_string_length == 0 && (psVar9 = local_88, this->type != Set)))) {
          std::__cxx11::string::_M_assign((string *)psVar9);
          std::__cxx11::string::assign((char *)&str);
        }
        else {
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                     &local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,(value_type *)
                               &subStruct.
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
          ;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cmd);
          std::__cxx11::string::assign((char *)&str);
          if ((0 < local_98) && (local_b8 = local_b8 + 1, local_b8 == local_98)) goto LAB_0012d021;
        }
      }
      std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                 &local_b0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
      std::__cxx11::string::_M_assign
                ((string *)
                 &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->label);
      std::__cxx11::string::assign((char *)&label);
      (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->parent
           = this;
      std::
      vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
      ::push_back(local_a0,&subStruct);
      lVar6 = parse(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,stream,local_80,local_78,0);
      goto LAB_0012ca4a;
    case 0x29:
      iVar5 = std::istream::peek();
      if (iVar5 == 0x3a) {
        while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (cVar4 = std::istream::get(), ' ' < cVar4))) {
          std::__cxx11::string::push_back((char)this + '(');
        }
      }
      if (str._M_string_length != 0) {
        if (((this->cmd)._M_string_length != 0) || (this->type == Set)) {
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                     &local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,(value_type *)
                               &subStruct.
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
          ;
LAB_0012cff3:
          local_88 = &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cmd;
        }
LAB_0012d001:
        std::__cxx11::string::_M_assign((string *)local_88);
        std::__cxx11::string::assign((char *)&str);
      }
LAB_0012d021:
      iStack_e0 = 0;
      goto LAB_0012d023;
    default:
      if (iVar5 == 9) {
        this->line = GlobalLine;
        goto LAB_0012cf7a;
      }
      if (iVar5 == 10) goto LAB_0012cba8;
      if (iVar5 == 0xd) {
        while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (this_00 = (RepliStruct *)stream, iVar5 = std::istream::peek(), iVar5 < 0x20))) {
          this_00 = (RepliStruct *)stream;
          iVar5 = std::istream::get();
          if (iVar5 == 10) {
LAB_0012cba8:
            GlobalLine = GlobalLine + 1;
          }
        }
        *local_78 = *local_80;
        uVar7 = getIndent(this_00,stream);
        iVar1 = local_98;
        *local_80 = uVar7;
        if (*local_78 < uVar7) {
          if ((local_8c & 1) == 0) {
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&subStruct.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                       &local_b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,(value_type *)
                                 &subStruct.
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       );
            lVar6 = parse(subStruct.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,stream,local_80,local_78,0);
          }
          else {
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&subStruct.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                       &local_b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = this;
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(subStruct.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->label);
            std::__cxx11::string::assign((char *)&label);
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,&subStruct);
            lVar6 = parse(subStruct.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,stream,local_80,local_78,0);
          }
          if (-1 < lVar6) {
            if ((local_98 < 1) || (local_b8 = local_b8 + 1, local_b8 != local_98)) {
              local_8c = 0;
              goto LAB_0012cdef;
            }
            goto LAB_0012d021;
          }
          goto LAB_0012d059;
        }
        if (uVar7 < *local_78) {
          if (str._M_string_length != 0) {
            if (((this->cmd)._M_string_length == 0) && (this->type != Set)) {
              std::__cxx11::string::_M_assign((string *)local_88);
              std::__cxx11::string::assign((char *)&str);
            }
            else {
              std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
              std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&subStruct.
                          super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                         &local_b0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_b0._M_refcount);
              (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->parent = this;
              std::
              vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              ::push_back(local_a0,(value_type *)
                                   &subStruct.
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                         );
              std::__cxx11::string::_M_assign
                        ((string *)
                         &(subStruct.
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->cmd);
              std::__cxx11::string::assign((char *)&str);
              if ((0 < iVar1) && (local_b8 + 1 == iVar1)) goto LAB_0012d021;
            }
          }
          iStack_e0 = ~*local_80 + *local_78;
          goto LAB_0012d023;
        }
        cVar4 = cVar2;
        if (str._M_string_length != 0) {
          if (((this->cmd)._M_string_length == 0) && ((this->type & ~Set) != Root))
          goto LAB_0012cdfd;
          std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
          std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                     &local_b0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
          (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parent = this;
          std::
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          ::push_back(local_a0,(value_type *)
                               &subStruct.
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
          ;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->cmd);
          std::__cxx11::string::assign((char *)&str);
          goto LAB_0012cd3a;
        }
        break;
      }
      if (iVar5 == 0x7d) {
        iVar5 = std::istream::peek();
        if (iVar5 == 0x3a) {
          while ((((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
                 (cVar4 = std::istream::get(), ' ' < cVar4))) {
            std::__cxx11::string::push_back((char)this + '(');
          }
        }
        if (str._M_string_length != 0) {
          if (((this->cmd)._M_string_length != 0) || ((this->type | Directive) == Development)) {
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&subStruct.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                       &local_b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,(value_type *)
                                 &subStruct.
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       );
            goto LAB_0012cff3;
          }
          goto LAB_0012d001;
        }
        goto LAB_0012d021;
      }
      if (iVar5 == 0x5d) {
        if (str._M_string_length == 0) goto LAB_0012d021;
        if (((this->cmd)._M_string_length == 0) && (this->type != Set)) goto LAB_0012d001;
        std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                   &local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
        (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent = this;
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(local_a0,(value_type *)
                             &subStruct.
                              super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>);
        goto LAB_0012cff3;
      }
      if (iVar5 == 0x7b) {
        if (str._M_string_length != 0) {
          psVar9 = &label;
          if ((cVar4 == ':') ||
             (((this->cmd)._M_string_length == 0 && (psVar9 = local_88, this->type != Set)))) {
            std::__cxx11::string::_M_assign((string *)psVar9);
            std::__cxx11::string::assign((char *)&str);
          }
          else {
            std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
            std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&subStruct.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                       &local_b0);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
            (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            parent = this;
            std::
            vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
            ::push_back(local_a0,(value_type *)
                                 &subStruct.
                                  super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       );
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(subStruct.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->cmd);
            std::__cxx11::string::assign((char *)&str);
            if ((0 < local_98) && (local_b8 = local_b8 + 1, local_b8 == local_98))
            goto LAB_0012d021;
          }
        }
        std::make_shared<r_comp::RepliStruct,r_comp::RepliStruct::Type>((Type *)&local_b0);
        std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>,
                   &local_b0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->label);
        std::__cxx11::string::assign((char *)&label);
        (subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        parent = this;
        std::
        vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
        ::push_back(local_a0,&subStruct);
        lVar6 = parse(subStruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,stream,local_80,local_78,0);
        goto LAB_0012ca4a;
      }
      if (iVar5 == 0x7c) {
        iVar5 = std::istream::peek();
        if (iVar5 != 0x5b) goto switchD_0012c534_caseD_22;
        std::istream::get();
        std::istream::get();
        std::__cxx11::string::append((char *)&str);
        cVar4 = cVar2;
        break;
      }
      if (iVar5 == 0x3b) {
        while ((cVar4 = cVar2, ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) == 0 &&
               (iVar5 = std::istream::peek(), iVar5 != 10))) {
          std::istream::get();
        }
        break;
      }
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
switchD_0012c534_caseD_22:
      std::__cxx11::string::push_back(cVar8);
      cVar4 = cVar2;
    }
  } while( true );
}

Assistant:

int64_t RepliStruct::parse(std::istream *stream, uint64_t &curIndent, uint64_t &prevIndent, int64_t paramExpect)
{
    char c = 0, lastc = 0, lastcc, tc;
    std::string str, label;
    std::shared_ptr<RepliStruct> subStruct;
    int64_t paramCount = 0;
    int64_t returnIndent = 0;
    bool expectSet = false;

    while (!stream->eof()) {
        lastcc = lastc;
        lastc = c;
        c = stream->get();

        // printf("%c", c);
        switch (c) {
        case '\t':
            line = GlobalLine;
            error += "Tabs chars are not permitted. ";
            return -1;

        case '!':
            if (this->type == Root) {
                subStruct = std::make_shared<RepliStruct>(Directive);
                subStruct->parent = this;
                args.push_back(subStruct);

                if (!subStruct->parseDirective(stream, curIndent, prevIndent)) {
                    return -1;
                }
            } else {
                error += "Directive not allowed inside a structure. ";
                return -1;
            }

            break;

        case '\n':
            GlobalLine++;

        case '\r':

            // skip all CR and LF
            while ((!stream->eof()) && (stream->peek() < 32))
                if (stream->get() == '\n') {
                    GlobalLine++;
                }

            // get indents
            prevIndent = curIndent;
            curIndent = getIndent(stream);

            // Are we in a parenthesis or set
            if (curIndent > prevIndent) {
                // Are we in a set
                if (expectSet) {
                    // Add new sub structure
                    subStruct = std::make_shared<RepliStruct>(Set);
                    subStruct->parent = this;
                    subStruct->label = label;
                    label = "";
                    args.push_back(subStruct);
                    returnIndent = subStruct->parse(stream, curIndent, prevIndent);
                    expectSet = false;

                    if (returnIndent < 0) {
                        return -1;
                    }

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }

                    if (returnIndent > 0) {
                        return (returnIndent - 1);
                    }
                }
                // or a parenthesis
                else {
                    subStruct = std::make_shared<RepliStruct>(Structure);
                    args.push_back(subStruct);
                    returnIndent = subStruct->parse(stream, curIndent, prevIndent);
                    expectSet = false;

                    if (returnIndent < 0) {
                        return -1;
                    }

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }

                    if (returnIndent > 0) {
                        return (returnIndent - 1);
                    }
                }
            } else if (curIndent < prevIndent) {
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }

                // current structure or set is complete
                return prevIndent - curIndent - 1;
            } else {
                // act as if we met a space
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set) || (type == Root)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }
            }

            break;

        case ';': // Comments
            while (!stream->eof() && stream->peek() != '\n') {
                stream->get(); // discard
            }

            break;

        case ' ':

            // next string is ready
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set) || (type == Development)) { // Modification from Eric to have the Development treat tpl vars as atoms instead of a Development.cmd
                    // Check if we need to read more tokens for the string
                    if (str[0] == '"' && str[str.length() - 1] != '"') {
                        str += ' ';

                        while (!stream->eof()) {
                            c = stream->get();
                            str += c;

                            if (c == '"') {
                                break;
                            }
                        }
                    }

                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            break;

        case '(':

            // Check for scenario 'xxx('
            if (str.size() > 0) {
                if (lastc == ':') { // label:(xxx)
                    label = str;
                    str = "";
                } else if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            subStruct = std::make_shared<RepliStruct>(Structure);
            subStruct->label = label;
            label = "";
            subStruct->parent = this;
            args.push_back(subStruct);
            returnIndent = subStruct->parse(stream, curIndent, prevIndent);

            if (returnIndent < 0) {
                return -1;
            }

            if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                return 0;
            }

            if (returnIndent > 0) {
                return (returnIndent - 1);
            }

            break;

        case ')':

            // Check for directive use of xxx):xxx or xxx):
            if (stream->peek() == ':') {
                // expect ':' or ':xxx'
                while ((!stream->eof()) && ((c = stream->get()) > 32)) {
                    tail += c;
                }
            }

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        case '{':

            // Check for scenario 'xxx{'
            if (str.size() > 0) {
                if (lastc == ':') { // label:{xxx}
                    label = str;
                    str = "";
                } else if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            subStruct = std::make_shared<RepliStruct>(Development);
            subStruct->label = label;
            label = "";
            subStruct->parent = this;
            args.push_back(subStruct);
            returnIndent = subStruct->parse(stream, curIndent, prevIndent);

            if (returnIndent < 0) {
                return -1;
            }

            if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                return 0;
            }

            if (returnIndent > 0) {
                return (returnIndent - 1);
            }

            break;

        case '}':

            // Check for directive use of xxx):xxx or xxx):
            if (stream->peek() == ':') {
                // expect ':' or ':xxx'
                while ((!stream->eof()) && ((c = stream->get()) > 32)) {
                    tail += c;
                }
            }

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set) || (type == Development)) { // Modification from Eric to have the Development treat tpl vars as atoms instead of a Development.cmd
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        case '|':
            if (stream->peek() == '[') {
                stream->get(); // read the [
                stream->get(); // read the ]
                str += "|[]";
            } else {
                str += c;
            }

            break;

        case '[': // set start
            if (lastc == ':') { // label:[xxx]
                label = str;
                str = "";
            }

            if (stream->peek() == ']') {
                stream->get(); // read the ]

                // if we have a <CR> or <LF> next we may have a line indent set
                if (((tc = stream->peek()) < 32) || (tc == ';')) {
                    expectSet = true;
                } else {
                    // this could be a xxx:[] or xxx[]
                    if ((lastc != ':') && (lastc > 32)) { // label[]
                        // act as if [] is part of the string and continue
                        str += "[]";
                        continue;
                    }

                    // create empty set
                    subStruct = std::make_shared<RepliStruct>(Set);
                    subStruct->parent = this;
                    subStruct->label = label;
                    args.push_back(subStruct);
                }
            } else {
                // Check for scenario 'xxx['
                if (str.size() > 0) {
                    if ((cmd.size() > 0) || (type == Set)) {
                        subStruct = std::make_shared<RepliStruct>(Atom);
                        subStruct->parent = this;
                        args.push_back(subStruct);
                        subStruct->cmd = str;
                        str = "";

                        if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                            return 0;
                        }
                    } else {
                        cmd = str;
                        str = "";
                    }
                }

                subStruct = std::make_shared<RepliStruct>(Set);
                subStruct->parent = this;
                subStruct->label = label;
                label = "";
                args.push_back(subStruct);
                returnIndent = subStruct->parse(stream, curIndent, prevIndent);

                if (returnIndent < 0) {
                    return -1;
                }

                if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                    return 0;
                }

                if (returnIndent > 0) {
                    return (returnIndent - 1);
                }
            }

            break;

        case ']':

            // We met a boundary, act as ' '
            if (str.size() > 0) {
                if ((cmd.size() > 0) || (type == Set)) {
                    subStruct = std::make_shared<RepliStruct>(Atom);
                    subStruct->parent = this;
                    args.push_back(subStruct);
                    subStruct->cmd = str;
                    str = "";

                    if ((paramExpect > 0) && (++paramCount == paramExpect)) {
                        return 0;
                    }
                } else {
                    cmd = str;
                    str = "";
                }
            }

            return 0;

        default:
            str += c;
            break;
        }
    }

    return 0;
}